

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

sysbvm_object_tuple_t * sysbvm_heap_allocatePointerTuple(sysbvm_heap_t *heap,size_t slotCount)

{
  sysbvm_object_tuple_t *psVar1;
  size_t in_RDX;
  
  psVar1 = sysbvm_heap_allocateTupleWithRawSize(heap,slotCount * 8 + 0x18,in_RDX);
  if (psVar1 != (sysbvm_object_tuple_t *)0x0) {
    (psVar1->header).identityHashAndFlags = heap->gcWhiteColor;
    (psVar1->header).objectSize = (uint32_t)(slotCount << 3);
  }
  return psVar1;
}

Assistant:

SYSBVM_API sysbvm_object_tuple_t *sysbvm_heap_allocatePointerTuple(sysbvm_heap_t *heap, size_t slotCount)
{
    size_t objectSize = slotCount*sizeof(sysbvm_object_tuple_t*);
    size_t allocationSize = sizeof(sysbvm_object_tuple_t) + objectSize;
    sysbvm_object_tuple_t *result = sysbvm_heap_allocateTupleWithRawSize(heap, allocationSize, 16);
    if(!result) return 0;

    result->header.identityHashAndFlags = (SYSBVM_TUPLE_OBJECT_KIND_POINTERS << SYSBVM_TUPLE_OBJECT_KIND_SHIFT) | (heap->gcWhiteColor << SYSBVM_TUPLE_GC_COLOR_SHIFT);
    result->header.objectSize = objectSize;
    return result;
}